

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O2

void readPrefs(void)

{
  Fl_Preferences opt_prefs;
  Fl_Preferences prefs;
  
  Fl_Preferences::Fl_Preferences(&prefs,SYSTEM,"fltk.org","fltk");
  Fl_Preferences::Fl_Preferences(&opt_prefs,&prefs,"options");
  Fl_Preferences::get(&opt_prefs,"ArrowFocus",opt[0] + 1,2);
  Fl_Preferences::get(&opt_prefs,"VisibleFocus",opt[1] + 1,2);
  Fl_Preferences::get(&opt_prefs,"DNDText",opt[2] + 1,2);
  Fl_Preferences::get(&opt_prefs,"ShowTooltips",opt[3] + 1,2);
  Fl_Preferences::get(&opt_prefs,"FNFCUsesGTK",opt[4] + 1,2);
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&opt_prefs);
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&prefs);
  Fl_Preferences::Fl_Preferences(&prefs,USER,"fltk.org","fltk");
  Fl_Preferences::Fl_Preferences(&opt_prefs,&prefs,"options");
  Fl_Preferences::get(&opt_prefs,"ArrowFocus",opt[0],2);
  Fl_Preferences::get(&opt_prefs,"VisibleFocus",opt[1],2);
  Fl_Preferences::get(&opt_prefs,"DNDText",opt[2],2);
  Fl_Preferences::get(&opt_prefs,"ShowTooltips",opt[3],2);
  Fl_Preferences::get(&opt_prefs,"FNFCUsesGTK",opt[4],2);
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&opt_prefs);
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&prefs);
  refreshUI();
  return;
}

Assistant:

static void readPrefs() {
  // read all preferences and refresh the GUI
  {
    Fl_Preferences prefs(Fl_Preferences::SYSTEM, "fltk.org", "fltk");
    Fl_Preferences opt_prefs(prefs, "options");
    opt_prefs.get("ArrowFocus", opt[Fl::OPTION_ARROW_FOCUS][1], 2);
    opt_prefs.get("VisibleFocus", opt[Fl::OPTION_VISIBLE_FOCUS][1], 2);
    opt_prefs.get("DNDText", opt[Fl::OPTION_DND_TEXT][1], 2);
    opt_prefs.get("ShowTooltips", opt[Fl::OPTION_SHOW_TOOLTIPS][1], 2);
    opt_prefs.get("FNFCUsesGTK", opt[Fl::OPTION_FNFC_USES_GTK ][1], 2);
  }
  {
    Fl_Preferences prefs(Fl_Preferences::USER, "fltk.org", "fltk");
    Fl_Preferences opt_prefs(prefs, "options");
    opt_prefs.get("ArrowFocus", opt[Fl::OPTION_ARROW_FOCUS][0], 2);
    opt_prefs.get("VisibleFocus", opt[Fl::OPTION_VISIBLE_FOCUS][0], 2);
    opt_prefs.get("DNDText", opt[Fl::OPTION_DND_TEXT][0], 2);
    opt_prefs.get("ShowTooltips", opt[Fl::OPTION_SHOW_TOOLTIPS][0], 2);
    opt_prefs.get("FNFCUsesGTK", opt[Fl::OPTION_FNFC_USES_GTK ][0], 2);
  }
  refreshUI();
}